

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef names)

{
  ulong uVar1;
  undefined8 start_00;
  bool bVar2;
  IResultCapture *pIVar3;
  size_type sVar4;
  reference pvVar5;
  StringRef SVar6;
  StringRef local_118;
  string local_108;
  StringRef local_e8;
  string local_d8;
  char local_b1;
  size_t sStack_b0;
  char c;
  size_t pos;
  stack<char,_std::deque<char,_std::allocator<char>_>_> openings;
  size_t start;
  anon_class_8_1_a855c668 skipq;
  anon_class_8_1_a855c668 trimmed;
  OfType local_2c;
  SourceLineInfo *pSStack_28;
  OfType resultType_local;
  SourceLineInfo *lineInfo_local;
  Capturer *this_local;
  StringRef macroName_local;
  
  macroName_local.m_start = (char *)macroName.m_size;
  this_local = (Capturer *)macroName.m_start;
  local_2c = resultType;
  pSStack_28 = lineInfo;
  lineInfo_local = (SourceLineInfo *)this;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->m_messages);
  pIVar3 = getResultCapture();
  this->m_resultCapture = pIVar3;
  this->m_captured = 0;
  openings.c.super__Deque_base<char,_std::allocator<char>_>._M_impl._72_8_ = 0;
  start = (size_t)&names;
  skipq.names = &names;
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,std::deque<char,std::allocator<char>>> *)&pos);
  sStack_b0 = 0;
  do {
    uVar1 = sStack_b0;
    sVar4 = StringRef::size(&names);
    if (sVar4 <= uVar1) {
      bVar2 = clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::empty
                        ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&pos);
      if (bVar2) {
        std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
        emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                  ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,
                   (StringRef *)&this_local,pSStack_28,&local_2c);
        start_00 = openings.c.super__Deque_base<char,_std::allocator<char>_>._M_impl._72_8_;
        sVar4 = StringRef::size(&names);
        local_118 = Capturer::anon_class_8_1_a855c668::operator()(&skipq,start_00,sVar4 - 1);
        StringRef::operator_cast_to_string(&local_108,&local_118);
        pvVar5 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::back
                           (&this->m_messages);
        std::__cxx11::string::operator=((string *)&pvVar5->message,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        pvVar5 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::back
                           (&this->m_messages);
        std::__cxx11::string::operator+=((string *)&pvVar5->message," := ");
        clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack
                  ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&pos);
        return;
      }
      __assert_fail("openings.empty() && \"Mismatched openings\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/MisterTea[P]UniversalStacktrace/external/Catch2/single_include/catch2/catch.hpp"
                    ,0x2e8e,
                    "Catch::Capturer::Capturer(StringRef, const SourceLineInfo &, ResultWas::OfType, StringRef)"
                   );
    }
    local_b1 = StringRef::operator[](&names,sStack_b0);
    if ((local_b1 == '\"') || (local_b1 == '\'')) {
      sStack_b0 = Capturer::anon_class_8_1_a855c668::operator()
                            ((anon_class_8_1_a855c668 *)&start,sStack_b0,local_b1);
    }
    else {
      if (local_b1 == '(') goto LAB_0024542a;
      if (local_b1 == ')') goto LAB_00245461;
      if (local_b1 == ',') {
        if (openings.c.super__Deque_base<char,_std::allocator<char>_>._M_impl._72_8_ != sStack_b0) {
          bVar2 = clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::empty
                            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&pos);
          if (bVar2) {
            std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
            emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                      ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,
                       (StringRef *)&this_local,pSStack_28,&local_2c);
            SVar6 = Capturer::anon_class_8_1_a855c668::operator()
                              (&skipq,openings.c.super__Deque_base<char,_std::allocator<char>_>.
                                      _M_impl._72_8_,sStack_b0);
            local_e8 = SVar6;
            StringRef::operator_cast_to_string(&local_d8,&local_e8);
            pvVar5 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::
                     back(&this->m_messages);
            std::__cxx11::string::operator=((string *)&pvVar5->message,(string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_d8);
            pvVar5 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::
                     back(&this->m_messages);
            std::__cxx11::string::operator+=((string *)&pvVar5->message," := ");
            openings.c.super__Deque_base<char,_std::allocator<char>_>._M_impl._72_8_ = sStack_b0;
          }
        }
        goto LAB_002455aa;
      }
      if (local_b1 == '[') {
LAB_0024542a:
        clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::push
                  ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&pos,&local_b1);
      }
      else {
        if (local_b1 != ']') {
          if (local_b1 == '{') goto LAB_0024542a;
          if (local_b1 != '}') goto LAB_002455aa;
        }
LAB_00245461:
        clara::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::pop
                  ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&pos);
      }
    }
LAB_002455aa:
    sStack_b0 = sStack_b0 + 1;
  } while( true );
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(static_cast<unsigned char>(names[start]))) {
                ++start;
            }
            while (names[end] == ',' || isspace(static_cast<unsigned char>(names[end]))) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };
        auto skipq = [&] (size_t start, char quote) {
            for (auto i = start + 1; i < names.size() ; ++i) {
                if (names[i] == quote)
                    return i;
                if (names[i] == '\\')
                    ++i;
            }
            CATCH_INTERNAL_ERROR("CAPTURE parsing encountered unmatched quote");
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case '"':
            case '\'':
                pos = skipq(pos, c);
                break;
            case ',':
                if (start != pos && openings.empty()) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = static_cast<std::string>(trimmed(start, pos));
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.empty() && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = static_cast<std::string>(trimmed(start, names.size() - 1));
        m_messages.back().message += " := ";
    }